

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

handle * __thiscall pybind11::handle::inc_ref(handle *this)

{
  PyObject *pPVar1;
  int iVar2;
  long *plVar3;
  allocator<char> local_31;
  string local_30;
  
  plVar3 = (long *)__tls_get_addr(&PTR_00167d18);
  *plVar3 = *plVar3 + 1;
  if (this->m_ptr != (PyObject *)0x0) {
    iVar2 = PyGILState_Check();
    if (iVar2 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,"pybind11::handle::inc_ref()",&local_31);
      throw_gilstate_error(this,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
    pPVar1 = this->m_ptr;
    if (pPVar1 != (PyObject *)0x0) {
      pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
    }
  }
  return this;
}

Assistant:

const handle &inc_ref() const & {
#ifdef PYBIND11_HANDLE_REF_DEBUG
        inc_ref_counter(1);
#endif
#ifdef PYBIND11_ASSERT_GIL_HELD_INCREF_DECREF
        if (m_ptr != nullptr && !PyGILState_Check()) {
            throw_gilstate_error("pybind11::handle::inc_ref()");
        }
#endif
        Py_XINCREF(m_ptr);
        return *this;
    }